

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O1

void soplex::LPFwriteSVector<double>
               (SPxLPBase<double> *p_lp,ostream *p_output,NameSet *p_cnames,
               SVectorBase<double> *p_svec,bool writeZeroCoefficients)

{
  ostream *poVar1;
  char *pcVar2;
  size_t sVar3;
  int iVar4;
  int i;
  double dVar5;
  char name [16];
  char local_48 [24];
  
  if (0 < (p_lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum) {
    iVar4 = 0;
    i = 0;
    do {
      dVar5 = SVectorBase<double>::operator[](p_svec,i);
      if (dVar5 != 0.0 || writeZeroCoefficients) {
        if (iVar4 == 0) {
          poVar1 = std::ostream::_M_insert<double>(dVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
          pcVar2 = getColName<double>(p_lp,i,p_cnames,local_48);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
          }
          else {
            sVar3 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar2,sVar3);
          }
        }
        else {
          if (iVar4 * -0x33333333 + 0x19999999U < 0x33333333) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output,"\n\t",2);
          }
          if (0.0 <= dVar5) {
            std::__ostream_insert<char,std::char_traits<char>>(p_output," + ",3);
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(p_output," - ",3);
            dVar5 = -dVar5;
          }
          std::ostream::_M_insert<double>(dVar5);
          std::__ostream_insert<char,std::char_traits<char>>(p_output," ",1);
          pcVar2 = getColName<double>(p_lp,i,p_cnames,local_48);
          if (pcVar2 == (char *)0x0) {
            std::ios::clear((int)p_output + (int)*(undefined8 *)(*(long *)p_output + -0x18));
          }
          else {
            sVar3 = strlen(pcVar2);
            std::__ostream_insert<char,std::char_traits<char>>(p_output,pcVar2,sVar3);
          }
        }
        iVar4 = iVar4 + 1;
      }
      i = i + 1;
    } while (i < (p_lp->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  return;
}

Assistant:

static void LPFwriteSVector(
   const SPxLPBase<R>&   p_lp,                         ///< the LP
   std::ostream&         p_output,                     ///< output stream
   const NameSet*        p_cnames,                     ///< column names
   const SVectorBase<R>& p_svec,                       ///< vector to write
   const bool            writeZeroCoefficients = false ///< write zero objective coefficients
)
{

   char name[16];
   int num_coeffs = 0;

   for(int j = 0; j < p_lp.nCols(); ++j)
   {
      const R coeff = p_svec[j];

      if(coeff == 0 && !writeZeroCoefficients)
         continue;

      if(num_coeffs == 0)
         p_output << coeff << " " << getColName(p_lp, j, p_cnames, name);
      else
      {
         // insert a line break every SOPLEX_NUM_ENTRIES_PER_LINE columns
         if(num_coeffs % SOPLEX_NUM_ENTRIES_PER_LINE == 0)
            p_output << "\n\t";

         if(coeff < 0)
            p_output << " - " << -coeff;
         else
            p_output << " + " << coeff;

         p_output << " " << getColName(p_lp, j, p_cnames, name);
      }

      ++num_coeffs;
   }
}